

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::wenc16(unsigned_short a,unsigned_short b,unsigned_short *l,unsigned_short *h)

{
  int iVar1;
  undefined6 in_register_00000032;
  uint uVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  
  uVar2 = (uint)CONCAT62(in_register_0000003a,a) ^ 0x8000;
  iVar1 = (int)CONCAT62(in_register_00000032,b);
  iVar3 = uVar2 - iVar1;
  *l = (ushort)((uint)iVar3 >> 0x10) & 0x8000 ^ (ushort)(uVar2 + iVar1 >> 1);
  *h = (unsigned_short)iVar3;
  return;
}

Assistant:

inline void wenc16(unsigned short a, unsigned short b, unsigned short &l,
                   unsigned short &h) {
  int ao = (a + A_OFFSET) & MOD_MASK;
  int m = ((ao + b) >> 1);
  int d = ao - b;

  if (d < 0) m = (m + M_OFFSET) & MOD_MASK;

  d &= MOD_MASK;

  l = static_cast<unsigned short>(m);
  h = static_cast<unsigned short>(d);
}